

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:489:63)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:489:63)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  long *plVar1;
  long lVar2;
  gc_heap *h;
  undefined4 uVar3;
  void *pvVar4;
  tm *ptVar5;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar6;
  wostream *pwVar7;
  native_error_exception *this_00;
  global_object *this_01;
  gc_heap_ptr<mjs::global_object> *this_02;
  _Put_time<wchar_t> __f;
  gc_heap_ptr<mjs::date_object> o;
  tm tm;
  wostringstream woss;
  gc_heap_ptr_untyped local_230;
  wstring_view local_220;
  long local_210 [2];
  double local_200;
  undefined1 local_1f8 [24];
  pointer pwStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  long lStack_1c0;
  char *local_1b8;
  wstring_view local_1b0;
  wstring local_1a0 [3];
  ios_base local_130 [264];
  
  make_date_object::anon_class_32_2_842af841::operator()
            ((anon_class_32_2_842af841 *)local_1f8,(value *)&this->f);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1f8);
  this_02 = &(this->f).global;
  local_200 = *(double *)((long)pvVar4 + 0x20);
  if (0x7fefffffffffffff < (ulong)ABS(local_200)) {
    this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
    this_01 = (global_object *)gc_heap_ptr_untyped::get(&this_02->super_gc_heap_ptr_untyped);
    global_object::stack_trace_abi_cxx11_(local_1a0,this_01);
    local_1f8._16_8_ = local_1a0[0]._M_string_length;
    pwStack_1e0 = local_1a0[0]._M_dataplus._M_p;
    local_220._M_len = 0xc;
    local_220._M_str = L"Invalid Date";
    native_error_exception::native_error_exception
              (this_00,range,(wstring_view *)(local_1f8 + 0x10),&local_220);
    __cxa_throw(this_00,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  local_1a0[0]._M_dataplus._M_p = (pointer)(long)(local_200 / 1000.0);
  ptVar5 = gmtime((time_t *)local_1a0);
  local_1f8._16_8_ = *(undefined8 *)ptVar5;
  pwStack_1e0._0_4_ = ptVar5->tm_hour;
  pwStack_1e0._4_4_ = ptVar5->tm_mday;
  local_1d8._0_4_ = ptVar5->tm_mon;
  local_1d8._4_4_ = ptVar5->tm_year;
  uStack_1d0._0_4_ = ptVar5->tm_wday;
  uStack_1d0._4_4_ = ptVar5->tm_yday;
  local_1c8 = *(undefined8 *)&ptVar5->tm_isdst;
  lStack_1c0 = ptVar5->tm_gmtoff;
  local_1b8 = ptVar5->tm_zone;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a0);
  __f._M_fmt = L"%Y-%m-%dT%H:%M:%S";
  __f._M_tmb = (tm *)(local_1f8 + 0x10);
  pbVar6 = std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_1a0,__f);
  plVar1 = *(long **)(pbVar6 + *(long *)(*(long *)pbVar6 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    uVar3 = (**(code **)(*plVar1 + 0x50))(plVar1,0x2e);
    local_220._M_len = CONCAT44(local_220._M_len._4_4_,uVar3);
    pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pbVar6,(wchar_t *)&local_220,1);
    lVar2 = *(long *)pwVar7;
    *(undefined8 *)(pwVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 3;
    lVar2 = *(long *)(lVar2 + -0x18);
    std::wios::fill();
    *(undefined4 *)(pwVar7 + lVar2 + 0xe0) = 0x30;
    pwVar7 = std::wostream::_M_insert<long>((long)pwVar7);
    plVar1 = *(long **)(pwVar7 + *(long *)(*(long *)pwVar7 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      uVar3 = (**(code **)(*plVar1 + 0x50))(plVar1,0x5a);
      local_220._M_len = CONCAT44(local_220._M_len._4_4_,uVar3);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar7,(wchar_t *)&local_220,1);
      h = (this_02->super_gc_heap_ptr_untyped).heap_;
      std::__cxx11::wstringbuf::str();
      local_1b0._M_len = (size_t)local_220._M_str;
      local_1b0._M_str = (wchar_t *)local_220._M_len;
      string::string((string *)&local_230,h,&local_1b0);
      if ((long *)local_220._M_len != local_210) {
        operator_delete((void *)local_220._M_len,local_210[0] * 4 + 4);
      }
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
      __return_storage_ptr__->type_ = string;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = local_230.heap_;
      *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_230.pos_;
      if (local_230.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_230.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_
                       );
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_230);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1f8);
      return __return_storage_ptr__;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }